

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O2

void __thiscall gimage::PNGImageIO::save(PNGImageIO *this,ImageU8 *image,char *name)

{
  int iVar1;
  FILE *__stream;
  __jmp_buf_tag *__env;
  char *pcVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  IOException *pIVar6;
  long i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long k;
  long lVar10;
  png_structp png;
  allocator local_e9;
  png_infop info;
  string tm;
  string vs;
  time_t tt;
  png_text text [2];
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar1 == '\0') || ((image->depth | 2U) != 3)) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&png);
    std::operator+(&vs,"Can only save PNG images with depth 1 or 3 (",&tm);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text,&vs,")"
                  );
    gutil::IOException::IOException(pIVar6,(string *)text);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"wb");
  if (__stream == (FILE *)0x0) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&png);
    std::operator+(&vs,"Cannot open file (",&tm);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text,&vs,")"
                  );
    gutil::IOException::IOException(pIVar6,(string *)text);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_write_struct("1.6.37",0,0);
  if (png != (png_structp)0x0) {
    info = (png_infop)png_create_info_struct(png);
    if (info == (png_infop)0x0) {
      png_destroy_write_struct(&png,0);
      fclose(__stream);
      pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)text,"Cannot allocate PNG info structure",(allocator *)&vs);
      gutil::IOException::IOException(pIVar6,(string *)text);
      __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      png_init_io(png,__stream);
      png_set_IHDR(png,info,(int)image->width,(int)image->height,8,(image->depth == 3) * '\x02',0,0,
                   0);
      std::__cxx11::string::string((string *)text,"cvkit version ",(allocator *)&tt);
      std::__cxx11::string::string((string *)&tm,"2.6.17",&local_e9);
      std::operator+(&vs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text,
                     &tm);
      std::__cxx11::string::~string((string *)&tm);
      std::__cxx11::string::~string((string *)text);
      tt = time((time_t *)0x0);
      pcVar2 = ctime(&tt);
      std::__cxx11::string::string((string *)&tm,pcVar2,(allocator *)text);
      text[0].text_length = 0;
      text[1].lang = (png_charp)0x0;
      text[1].lang_key = (png_charp)0x0;
      text[1].text_length = 0;
      text[1].itxt_length = 0;
      text[1].key = (png_charp)0x0;
      text[1].text = (png_charp)0x0;
      text[0].lang_key = (png_charp)0x0;
      text[1].compression = 0;
      text[1]._4_4_ = 0;
      text[0].itxt_length = 0;
      text[0].lang = (png_charp)0x0;
      text[0].compression = -1;
      text[0]._4_4_ = 0;
      text[0].key = "Software";
      text[0].text = vs._M_dataplus._M_p;
      text[0].text_length = strlen(vs._M_dataplus._M_p);
      text[1].compression = -1;
      text[1].key = "Creation Time";
      text[1].text = tm._M_dataplus._M_p;
      text[1].text_length = strlen(tm._M_dataplus._M_p);
      png_set_text(png,info,text,2);
      png_write_info(png,info);
      uVar3 = (long)image->depth * image->width;
      uVar9 = 0xffffffffffffffff;
      if (-1 < (long)uVar3) {
        uVar9 = uVar3;
      }
      pvVar4 = operator_new__(uVar9);
      for (lVar10 = 0; lVar10 < image->height; lVar10 = lVar10 + 1) {
        pvVar5 = pvVar4;
        for (lVar7 = 0; lVar7 < image->width; lVar7 = lVar7 + 1) {
          for (lVar8 = 0; lVar8 < image->depth; lVar8 = lVar8 + 1) {
            *(uchar *)((long)pvVar5 + lVar8) = image->img[lVar8][lVar10][lVar7];
          }
          pvVar5 = (void *)((long)pvVar5 + lVar8);
        }
        png_write_row(png,pvVar4);
      }
      png_write_end(png,info);
      operator_delete__(pvVar4);
      fclose(__stream);
      png_destroy_write_struct(&png,&info);
      std::__cxx11::string::~string((string *)&tm);
      std::__cxx11::string::~string((string *)&vs);
      return;
    }
    png_destroy_write_struct(&png,&info);
    fclose(__stream);
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&tt);
    std::operator+(&vs,"Cannot read PNG file (",&tm);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text,&vs,")"
                  );
    gutil::IOException::IOException(pIVar6,(string *)text);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  fclose(__stream);
  pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)text,"Cannot allocate handle for writing PNG files",(allocator *)&vs);
  gutil::IOException::IOException(pIVar6,(string *)text);
  __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNGImageIO::save(const ImageU8 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // initialize writing a png file

  FILE *out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(out);
    throw gutil::IOException("Cannot allocate handle for writing PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_write_struct(&png, static_cast<png_infopp>(0));
    fclose(out);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] row;

    png_destroy_write_struct(&png, &info);
    fclose(out);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // write header

  png_init_io(png, out);

  int color=PNG_COLOR_TYPE_GRAY;

  if (image.getDepth() == 3)
  {
    color=PNG_COLOR_TYPE_RGB;
  }

  png_set_IHDR(png, info, image.getWidth(), image.getHeight(), 8, color,
               PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
               PNG_FILTER_TYPE_DEFAULT);

  std::string vs=std::string("cvkit version ")+std::string(VERSION);

  time_t tt=time(0);
  std::string tm=ctime(&tt);

  png_text text[2];
  memset(text, 0, 2*sizeof(png_text));

  text[0].compression=PNG_TEXT_COMPRESSION_NONE;
  text[0].key=const_cast<char *>("Software");
  text[0].text=const_cast<char *>(vs.c_str());
  text[0].text_length=strlen(text[0].text);

  text[1].compression=PNG_TEXT_COMPRESSION_NONE;
  text[1].key=const_cast<char *>("Creation Time");
  text[1].text=const_cast<char *>(tm.c_str());
  text[1].text_length=strlen(text[1].text);

  png_set_text(png, info, text, 2);

  png_write_info(png, info);

  // write image

  row=new unsigned char [image.getDepth()*image.getWidth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    unsigned char *rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=image.get(i, k, j);
      }
    }

    png_write_row(png, row);
  }

  // finish writing and close file

  png_write_end(png, info);

  delete [] row;

  fclose(out);

  png_destroy_write_struct(&png, &info);
}